

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O1

void __thiscall DestListHeader::printDestListHeaderInHexStyle(DestListHeader *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_____________DestListHeader in HEX style________________",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Version:                            ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,&this->Version);
  Utils::print_vec(&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,&this->TotalNumberOfCurrentEntries);
  Utils::print_vec(&local_50);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,&this->TotalNumberOfPinnedEntries);
  Utils::print_vec(&local_68);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unknown:                            ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->Unknown);
  Utils::print_vec(&local_80);
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"LastIssuedEntryId:                  ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,&this->LastIssuedEntryId);
  Utils::print_vec(&local_98);
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,&this->NumberOfAddedDeletedReopened);
  Utils::print_vec(&local_b0);
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_________________________________________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void DestListHeader::printDestListHeaderInHexStyle() {
    cout << "_____________DestListHeader in HEX style________________" << endl;
    cout << "Version:                            "; Utils::print_vec(Version);
    cout << "TotalNumberOfCurrentEntries:        "; Utils::print_vec(TotalNumberOfCurrentEntries);
    cout << "TotalNumberOfPinnedEntries:         "; Utils::print_vec(TotalNumberOfPinnedEntries);
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  "; Utils::print_vec(LastIssuedEntryId);
    cout << "NumberOfAddedDeletedReopened:       "; Utils::print_vec(NumberOfAddedDeletedReopened);
    cout << "_________________________________________________________" << endl;
}